

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O1

string * __thiscall
Test::Formats::internal::utf16_to_string_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char16_t *ptr,size_t length)

{
  pointer pcVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char16_t *pcVar5;
  uint uVar6;
  uint32_t code;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (NATIVE_UTF8) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_70,(size_type)ptr);
    if (ptr != (char16_t *)0x0) {
      pcVar5 = (char16_t *)0x0;
      uVar6 = 0;
      do {
        code = (uint32_t)*(ushort *)(this + (long)pcVar5 * 2);
        if ((code & 0xfc00) == 0xdc00) {
          code = *(ushort *)(this + (long)pcVar5 * 2) & 0x3ff | uVar6;
LAB_0011ba59:
          uVar6 = 0;
          appendAsUtf8(code,&local_70);
        }
        else {
          if ((code & 0xfc00) != 0xd800) goto LAB_0011ba59;
          uVar6 = (code & 0x3ff) * 0x400 + 0x10000;
        }
        pcVar5 = (char16_t *)((long)pcVar5 + 1);
      } while (ptr != pcVar5);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_70);
    std::operator+(&local_50,"\'",&local_70);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_50,"\'");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar4) {
      uVar2 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"(unknown encoding)","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::internal::utf16_to_string(const char16_t *ptr, std::size_t length) {
  if (NATIVE_UTF8) {
    // Convert UTF-16 to UTF-8
    std::string result{};
    result.reserve(length);

    uint32_t code = 0;
    for (std::size_t i = 0; i < length; ++i) {
      auto val = static_cast<uint16_t>(ptr[i]);
      if ((val & 0xFC00) == 0xD800) {
        code = (val & 0x03FFU) << 10;
        code += 0x10000;
        continue;
      } else if ((val & 0xFC00) == 0xDC00) {
        code |= (val & 0x03FFU);
      } else {
        code = val;
      }
      appendAsUtf8(code, result);
      code = 0;
    }

    result.shrink_to_fit();
    return "'" + result + "'";
  }
#ifdef _MSC_VER
  std::mbstate_t state{};
  std::string result;
  for (std::size_t i = 0; i < length; ++i) {
    std::array<char, MB_LEN_MAX> tmp{};
    std::size_t rc = std::c16rtomb(tmp.data(), ptr[i], &state);
    if (rc == static_cast<std::size_t>(-1)) {
      result.push_back('?');
      state = std::mbstate_t{};
      rc = 0;
    }
    for (std::size_t i = 0; i < rc; ++i) {
      result.push_back(tmp[i]);
    }
  }
  return "'" + result + "'";
#else
  return "(unknown encoding)";
#endif
}